

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int tcmalloc_backtrace_get_view
              (backtrace_state *state,int descriptor,off_t offset,uint64_t size,
              backtrace_error_callback error_callback,void *data,backtrace_view *view)

{
  __off_t _Var1;
  int *piVar2;
  void *pvVar3;
  ssize_t sVar4;
  ssize_t r;
  uint64_t got;
  void *data_local;
  backtrace_error_callback error_callback_local;
  uint64_t size_local;
  off_t offset_local;
  int descriptor_local;
  backtrace_state *state_local;
  
  _Var1 = lseek(descriptor,offset,0);
  if (_Var1 < 0) {
    piVar2 = __errno_location();
    (*error_callback)(data,"lseek",*piVar2);
    state_local._4_4_ = 0;
  }
  else {
    pvVar3 = tcmalloc_backtrace_alloc(state,size,error_callback,data);
    view->base = pvVar3;
    if (view->base == (void *)0x0) {
      state_local._4_4_ = 0;
    }
    else {
      view->data = view->base;
      view->len = size;
      for (r = 0; (ulong)r < size; r = sVar4 + r) {
        sVar4 = read(descriptor,view->base,size - r);
        if (sVar4 < 0) {
          piVar2 = __errno_location();
          (*error_callback)(data,"read",*piVar2);
          tc_free(view->base);
          return 0;
        }
        if (sVar4 == 0) break;
      }
      if ((ulong)r < size) {
        (*error_callback)(data,"file too short",0);
        tc_free(view->base);
        state_local._4_4_ = 0;
      }
      else {
        state_local._4_4_ = 1;
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

int
backtrace_get_view (struct backtrace_state *state, int descriptor,
		    off_t offset, uint64_t size,
		    backtrace_error_callback error_callback,
		    void *data, struct backtrace_view *view)
{
  uint64_t got;
  ssize_t r;

  if ((uint64_t) (size_t) size != size)
    {
      error_callback (data, "file size too large", 0);
      return 0;
    }

  if (lseek (descriptor, offset, SEEK_SET) < 0)
    {
      error_callback (data, "lseek", errno);
      return 0;
    }

  view->base = backtrace_alloc (state, size, error_callback, data);
  if (view->base == NULL)
    return 0;
  view->data = view->base;
  view->len = size;

  got = 0;
  while (got < size)
    {
      r = read (descriptor, view->base, size - got);
      if (r < 0)
	{
	  error_callback (data, "read", errno);
	  free (view->base);
	  return 0;
	}
      if (r == 0)
	break;
      got += (uint64_t) r;
    }

  if (got < size)
    {
      error_callback (data, "file too short", 0);
      free (view->base);
      return 0;
    }

  return 1;
}